

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

char * get_status_string(int status_code,int upgrade)

{
  int upgrade_local;
  int status_code_local;
  
  switch(status_code) {
  case 100:
    _upgrade_local = "100 Continue";
    break;
  case 0x65:
    _upgrade_local = "101 Switching Protocols";
    break;
  default:
    _upgrade_local = "";
    break;
  case 200:
    _upgrade_local = "200 OK";
    if (upgrade != 0) {
      _upgrade_local = "200 Connection established";
    }
    break;
  case 0xc9:
    _upgrade_local = "201 Created";
    break;
  case 0xca:
    _upgrade_local = "202 Accepted";
    break;
  case 0xcb:
    _upgrade_local = "203 Non-Authoritative Information";
    break;
  case 0xcc:
    _upgrade_local = "204 No Content";
    break;
  case 0xcd:
    _upgrade_local = "205 Reset Content";
    break;
  case 0xce:
    _upgrade_local = "206 Partial Content";
    break;
  case 300:
    _upgrade_local = "300 Multiple Choices";
    break;
  case 0x12d:
    _upgrade_local = "301 Moved Permanently";
    break;
  case 0x12e:
    _upgrade_local = "302 Found";
    break;
  case 0x12f:
    _upgrade_local = "303 See Other";
    break;
  case 0x130:
    _upgrade_local = "304 Not Modified";
    break;
  case 0x131:
    _upgrade_local = "305 Use Proxy";
    break;
  case 0x132:
    _upgrade_local = "306 (Unused)";
    break;
  case 0x133:
    _upgrade_local = "307 Temporary Redirect";
    break;
  case 400:
    _upgrade_local = "400 Bad Request";
    break;
  case 0x191:
    _upgrade_local = "401 Unauthorized";
    break;
  case 0x192:
    _upgrade_local = "402 Payment Required";
    break;
  case 0x193:
    _upgrade_local = "403 Forbidden";
    break;
  case 0x194:
    _upgrade_local = "404 Not Found";
    break;
  case 0x195:
    _upgrade_local = "405 Method Not Allowed";
    break;
  case 0x196:
    _upgrade_local = "406 Not Acceptable";
    break;
  case 0x197:
    _upgrade_local = "407 Proxy Authentication Required";
    break;
  case 0x198:
    _upgrade_local = "408 Request Timeout";
    break;
  case 0x199:
    _upgrade_local = "409 Conflict";
    break;
  case 0x19a:
    _upgrade_local = "410 Gone";
    break;
  case 0x19b:
    _upgrade_local = "411 Length Required";
    break;
  case 0x19c:
    _upgrade_local = "412 Precondition Failed";
    break;
  case 0x19d:
    _upgrade_local = "413 Request Entity Too Large";
    break;
  case 0x19e:
    _upgrade_local = "414 Request-URI Too Long";
    break;
  case 0x19f:
    _upgrade_local = "415 Unsupported Media Type";
    break;
  case 0x1a0:
    _upgrade_local = "416 Requested Range Not Satisfiable";
    break;
  case 0x1a1:
    _upgrade_local = "417 Expectation Failed";
    break;
  case 500:
    _upgrade_local = "500 Internal Server Error";
    break;
  case 0x1f5:
    _upgrade_local = "501 Not Implemented";
    break;
  case 0x1f6:
    _upgrade_local = "502 Bad Gateway";
    break;
  case 0x1f7:
    _upgrade_local = "503 Service Unavailable";
    break;
  case 0x1f8:
    _upgrade_local = "504 Gateway Timeout";
    break;
  case 0x1f9:
    _upgrade_local = "505 HTTP Version Not Supported";
  }
  return _upgrade_local;
}

Assistant:

static const char* get_status_string(int status_code, int upgrade)
{
  switch(status_code) {
  case 100: return "100 Continue";
  case 101: return "101 Switching Protocols";
  case 200: return (upgrade?"200 Connection established":"200 OK");
  case 201: return "201 Created";
  case 202: return "202 Accepted";
  case 203: return "203 Non-Authoritative Information";
  case 204: return "204 No Content";
  case 205: return "205 Reset Content";
  case 206: return "206 Partial Content";
  case 300: return "300 Multiple Choices";
  case 301: return "301 Moved Permanently";
  case 302: return "302 Found";
  case 303: return "303 See Other";
  case 304: return "304 Not Modified";
  case 305: return "305 Use Proxy";
  case 306: return "306 (Unused)";
  case 307: return "307 Temporary Redirect";
  case 400: return "400 Bad Request";
  case 401: return "401 Unauthorized";
  case 402: return "402 Payment Required";
  case 403: return "403 Forbidden";
  case 404: return "404 Not Found";
  case 405: return "405 Method Not Allowed";
  case 406: return "406 Not Acceptable";
  case 407: return "407 Proxy Authentication Required";
  case 408: return "408 Request Timeout";
  case 409: return "409 Conflict";
  case 410: return "410 Gone";
  case 411: return "411 Length Required";
  case 412: return "412 Precondition Failed";
  case 413: return "413 Request Entity Too Large";
  case 414: return "414 Request-URI Too Long";
  case 415: return "415 Unsupported Media Type";
  case 416: return "416 Requested Range Not Satisfiable";
  case 417: return "417 Expectation Failed";
  case 500: return "500 Internal Server Error";
  case 501: return "501 Not Implemented";
  case 502: return "502 Bad Gateway";
  case 503: return "503 Service Unavailable";
  case 504: return "504 Gateway Timeout";
  case 505: return "505 HTTP Version Not Supported";
  default: return "";
  }
}